

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_uu.c
# Opt level: O1

int uudecode_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  byte *pbVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  ssize_t avail;
  size_t nbytes_read;
  ssize_t nl;
  ssize_t ravail;
  byte *local_58;
  ulong local_50;
  ulong local_48;
  long local_40;
  ulong local_38;
  
  local_58 = (byte *)__archive_read_filter_ahead(filter,1,(ssize_t *)&local_50);
  if (local_58 == (byte *)0x0) {
    return 0;
  }
  local_38 = local_50;
  local_48 = local_50;
  uVar5 = 0x14;
  do {
    uVar3 = bid_get_line(filter,&local_58,(ssize_t *)&local_50,(ssize_t *)&local_38,&local_40,
                         &local_48);
    if ((long)uVar3 < 0) {
      return 0;
    }
    if (local_40 == 0) {
      return 0;
    }
    if (((long)(uVar3 - local_40) < 0xb) ||
       (*(short *)(local_58 + 4) != 0x206e || *(int *)local_58 != 0x69676562)) {
      if ((0x11 < (long)(uVar3 - local_40)) &&
         (*(long *)(local_58 + 5) == 0x203436657361622d && *(long *)local_58 == 0x61622d6e69676562))
      {
        lVar4 = 0xd;
        goto LAB_00449cf8;
      }
      bVar2 = false;
      lVar4 = 0;
    }
    else {
      lVar4 = 6;
LAB_00449cf8:
      bVar2 = true;
    }
    uVar11 = (uint)lVar4;
    if ((((!bVar2) || ((byte)(local_58[lVar4] - 0x38) < 0xf8)) ||
        ((byte)(local_58[lVar4 + 1] - 0x38) < 0xf8)) ||
       (((byte)(local_58[lVar4 + 2] - 0x38) < 0xf8 || (local_58[lVar4 + 3] != 0x20)))) {
      uVar11 = 0;
    }
    local_58 = local_58 + uVar3;
    if (uVar11 != 0) {
      uVar6 = 0;
      if (local_50 == uVar3) {
        return 0;
      }
      local_50 = local_50 - uVar3;
      uVar3 = bid_get_line(filter,&local_58,(ssize_t *)&local_50,(ssize_t *)&local_38,&local_40,
                           &local_48);
      if (local_40 == 0 || (long)uVar3 < 0) {
        return 0;
      }
      lVar4 = local_50 - uVar3;
      uVar7 = uVar3;
      if (uVar11 != 6) goto LAB_00449f17;
      bVar1 = *local_58;
      if (""[bVar1] == '\0') {
        return 0;
      }
      local_58 = local_58 + 1;
      uVar10 = bVar1 & 0x3f;
      uVar11 = uVar10 ^ 0x20;
      if (0x2d < (byte)uVar11) {
        return 0;
      }
      uVar7 = uVar3 - 1;
      lVar9 = uVar7 - local_40;
      if ((char)uVar10 == ' ') goto LAB_00449eb5;
      break;
    }
    uVar5 = 0;
    local_50 = local_50 - uVar3;
    if (0x1ffff < local_48) {
      return 0;
    }
  } while( true );
  while( true ) {
    if (""[*local_58] == '\0') {
      return 0;
    }
    if (""[local_58[1]] == '\0') {
      return 0;
    }
    if ((int)uVar11 < 2) {
      uVar7 = uVar7 - 2;
      iVar12 = 0;
      local_58 = local_58 + 2;
    }
    else {
      if (""[local_58[2]] == '\0') {
        return 0;
      }
      uVar7 = uVar7 - 3;
      iVar12 = uVar11 - 2;
      local_58 = local_58 + 3;
    }
    if (iVar12 < 1) {
      uVar11 = 0;
    }
    else {
      bVar1 = *local_58;
      local_58 = local_58 + 1;
      if (""[bVar1] == '\0') {
        return 0;
      }
      uVar7 = uVar7 - 1;
      uVar11 = iVar12 - 1;
    }
    lVar9 = uVar7 - local_40;
    if (uVar11 == 0) break;
    if (lVar9 < 1) break;
  }
LAB_00449eb5:
  if (-1 < lVar9) {
    if ((lVar9 == 1) && (""[*local_58] != '\0' || (byte)(*local_58 + 0x9f) < 0x1a)) {
      local_58 = local_58 + 1;
      uVar7 = uVar7 - 1;
    }
    local_58 = local_58 + local_40;
    if ((local_50 == uVar3) || (""[*local_58] == '\0')) {
LAB_00449f17:
      if (uVar11 == 0xd) {
        pbVar8 = local_58;
        if (uVar7 - local_40 != 0 && local_40 <= (long)uVar7) {
          pbVar8 = local_58 + (uVar7 - local_40);
          do {
            if (""[*local_58] == '\0') {
              return 0;
            }
            uVar7 = uVar7 - 1;
            local_58 = local_58 + 1;
          } while (local_40 < (long)uVar7);
        }
        pbVar8 = pbVar8 + local_40;
        if (((lVar4 < 5) || (pbVar8[4] != 10 || *(int *)pbVar8 != 0x3d3d3d3d)) &&
           ((lVar4 < 6 || (*(short *)(pbVar8 + 4) != 0xa0d || *(int *)pbVar8 != 0x3d3d3d3d)))) {
          if (0 < lVar4) {
            uVar6 = 0;
            if (""[*pbVar8] != '\0') {
              uVar6 = uVar5 + 0x1e;
            }
          }
        }
        else {
          uVar6 = uVar5 | 0x28;
        }
      }
    }
    else {
      uVar6 = uVar5 + 0x1e;
    }
  }
  return uVar6;
}

Assistant:

static int
uudecode_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *b;
	ssize_t avail, ravail;
	ssize_t len, nl;
	int l;
	int firstline;
	size_t nbytes_read;

	(void)self; /* UNUSED */

	b = __archive_read_filter_ahead(filter, 1, &avail);
	if (b == NULL)
		return (0);

	firstline = 20;
	ravail = avail;
	nbytes_read = avail;
	for (;;) {
		len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
		if (len < 0 || nl == 0)
			return (0); /* No match found. */
		if (len - nl >= 11 && memcmp(b, "begin ", 6) == 0)
			l = 6;
		else if (len -nl >= 18 && memcmp(b, "begin-base64 ", 13) == 0)
			l = 13;
		else
			l = 0;

		if (l > 0 && (b[l] < '0' || b[l] > '7' ||
		    b[l+1] < '0' || b[l+1] > '7' ||
		    b[l+2] < '0' || b[l+2] > '7' || b[l+3] != ' '))
			l = 0;

		b += len;
		avail -= len;
		if (l)
			break;
		firstline = 0;

		/* Do not read more than UUENCODE_BID_MAX_READ bytes */
		if (nbytes_read >= UUENCODE_BID_MAX_READ)
			return (0);
	}
	if (!avail)
		return (0);
	len = bid_get_line(filter, &b, &avail, &ravail, &nl, &nbytes_read);
	if (len < 0 || nl == 0)
		return (0);/* There are non-ascii characters. */
	avail -= len;

	if (l == 6) {
		if (!uuchar[*b])
			return (0);
		/* Get a length of decoded bytes. */
		l = UUDECODE(*b++); len--;
		if (l > 45)
			/* Normally, maximum length is 45(character 'M'). */
			return (0);
		while (l && len-nl > 0) {
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				if (!uuchar[*b++])
					return (0);
				len -= 2;
				--l;
			}
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				--len;
				--l;
			}
			if (l > 0) {
				if (!uuchar[*b++])
					return (0);
				--len;
				--l;
			}
		}
		if (len-nl < 0)
			return (0);
		if (len-nl == 1 &&
		    (uuchar[*b] ||		 /* Check sum. */
		     (*b >= 'a' && *b <= 'z'))) {/* Padding data(MINIX). */
			++b;
			--len;
		}
		b += nl;
		if (avail && uuchar[*b])
			return (firstline+30);
	}
	if (l == 13) {
		while (len-nl > 0) {
			if (!base64[*b++])
				return (0);
			--len;
		}
		b += nl;

		if (avail >= 5 && memcmp(b, "====\n", 5) == 0)
			return (firstline+40);
		if (avail >= 6 && memcmp(b, "====\r\n", 6) == 0)
			return (firstline+40);
		if (avail > 0 && base64[*b])
			return (firstline+30);
	}

	return (0);
}